

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

bool __thiscall Func::DoRecordNativeMap(Func *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  
  bVar1 = true;
  if (!VTuneChakraProfile::isJitProfilingActive) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015ad2f8,EncoderPhase,sourceContextId,functionId);
    bVar1 = (bool)(bVar1 & DAT_015d346a);
  }
  return bVar1;
}

Assistant:

bool Func::DoRecordNativeMap() const
{
#if defined(VTUNE_PROFILING)
    if (VTuneChakraProfile::isJitProfilingActive)
    {
        return true;
    }
#endif
#if DBG_DUMP
    return PHASE_DUMP(Js::EncoderPhase, this) && Js::Configuration::Global.flags.Verbose;
#else
    return false;
#endif
}